

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall cfd::core::Address::CalculateP2SH(Address *this,uint8_t prefix)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData local_70;
  ByteData local_48;
  undefined1 local_30 [8];
  ByteData160 script_hash;
  uint8_t prefix_local;
  Address *this_local;
  
  script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = prefix;
  Script::GetData(&local_48,&this->redeem_script_);
  HashUtil::Hash160((ByteData160 *)local_30,&local_48);
  ByteData::~ByteData(&local_48);
  CalculateP2SH(this,(ByteData160 *)local_30,
                script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
  ByteData160::GetBytes(&local_88,(ByteData160 *)local_30);
  ByteData::ByteData(&local_70,&local_88);
  ByteData::operator=(&this->hash_,&local_70);
  ByteData::~ByteData(&local_70);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  ByteData160::~ByteData160((ByteData160 *)local_30);
  return;
}

Assistant:

void Address::CalculateP2SH(uint8_t prefix) {
  // create script hash.
  ByteData160 script_hash = HashUtil::Hash160(redeem_script_.GetData());
  CalculateP2SH(script_hash, prefix);
  hash_ = ByteData(script_hash.GetBytes());
}